

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_is_inter_block(AV1_COMMON *cm,MACROBLOCKD *xd,int segment_id,aom_reader *r)

{
  int iVar1;
  int in_EDX;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  int is_inter;
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  int frame;
  aom_cdf_prob *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),(uint8_t)in_EDX,'\x05');
  if (iVar1 == 0) {
    iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),(uint8_t)in_EDX,'\a');
    if (iVar1 == 0) {
      av1_get_intra_inter_context(in_RSI);
      local_4 = aom_read_symbol_((aom_reader *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8,0);
    }
    else {
      local_4 = 1;
    }
  }
  else {
    iVar1 = get_segdata((segmentation *)(in_RDI + 19000),in_EDX,'\x05');
    if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = (uint)(iVar1 != 0);
    }
  }
  return local_4;
}

Assistant:

static int read_is_inter_block(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                               int segment_id, aom_reader *r) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME)) {
    const int frame = get_segdata(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
    if (frame < LAST_FRAME) return 0;
    return frame != INTRA_FRAME;
  }
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_GLOBALMV)) {
    return 1;
  }
  const int ctx = av1_get_intra_inter_context(xd);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const int is_inter =
      aom_read_symbol(r, ec_ctx->intra_inter_cdf[ctx], 2, ACCT_STR);
  return is_inter;
}